

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreSkipTables.h
# Opt level: O2

bool __thiscall
axl::sl::BoyerMooreGoodSkipTableBase<char>::build
          (BoyerMooreGoodSkipTableBase<char> *this,char *pattern,size_t patternLength)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  bVar2 = Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::
          setCountImpl<axl::sl::SimpleArrayDetails<unsigned_long>::Construct>
                    ((Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)this,
                     patternLength);
  if (bVar2) {
    puVar4 = Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::p
                       ((Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)this);
    lVar6 = 0;
    lVar1 = patternLength - 1;
    lVar7 = lVar1;
    for (lVar8 = lVar1; -1 < lVar8; lVar8 = lVar8 + -1) {
      bVar3 = isPrefix(pattern,patternLength,lVar8 + 1);
      if (bVar3) {
        lVar7 = lVar8 + 1;
      }
      puVar4[lVar8] = lVar7 + lVar6;
      lVar6 = lVar6 + 1;
    }
    lVar8 = 0;
    lVar7 = lVar1;
    while (lVar7 != 0) {
      sVar5 = calcSuffixLength(pattern,patternLength,lVar8);
      if (pattern[lVar8 - sVar5] != pattern[lVar1 - sVar5]) {
        puVar4[lVar1 - sVar5] = sVar5 + lVar7;
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + -1;
    }
  }
  return bVar2;
}

Assistant:

bool
	build(
		const C* pattern,
		size_t patternLength
	) {
		bool result = m_table.setCount(patternLength);
		if (!result)
			return false;

		sl::Array<size_t>::Rwi rwi = m_table;
		intptr_t lastPrefixPos = patternLength - 1;
		for (intptr_t i = patternLength - 1; i >= 0; i--) {
			if (isPrefix(pattern, patternLength, i + 1))
				lastPrefixPos = i + 1;

			rwi[i] = lastPrefixPos + patternLength - 1 - i;
		}

		for (intptr_t i = 0; i < patternLength - 1; i++) {
			size_t suffixLength = calcSuffixLength(pattern, patternLength, i);
			if (pattern[i - suffixLength] != pattern[patternLength - 1 - suffixLength])
				rwi[patternLength - 1 - suffixLength] = patternLength - 1 - i + suffixLength;
		}

		return true;
	}